

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::BatchNorm_x86_avx::forward_inplace(BatchNorm_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined8 uVar5;
  void *pvVar6;
  int *piVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  float *pfVar12;
  Mat *in_RSI;
  long *in_RDI;
  undefined1 auVar13 [32];
  __m128 _p_7;
  __m128 _b128;
  __m128 _a128;
  __m256 _p_6;
  __m256 _b256;
  __m256 _a256;
  int i_6;
  float b;
  float a;
  float *ptr_6;
  int q_2;
  int size;
  int d;
  int h;
  int w;
  __m128 _p_5;
  int i_5;
  float *ptr_5;
  __m128 _b_5;
  __m128 _a_5;
  int q_1;
  int size_2;
  int c_1;
  int d_2;
  int h_4;
  int w_6;
  __m128 _p_4;
  int j_1;
  float *ptr_4;
  __m128 _b_4;
  __m128 _a_4;
  int i_4;
  int h_3;
  int w_5;
  __m128 _p_3;
  __m128 _b_3;
  __m128 _a_3;
  float *ptr_3;
  int i_3;
  int w_4;
  __m256 _p_2;
  int i_2;
  float *ptr_2;
  __m256 _b_2;
  __m256 _a_2;
  int q;
  int size_1;
  int c;
  int d_1;
  int h_2;
  int w_3;
  __m256 _p_1;
  int j;
  float *ptr_1;
  __m256 _b_1;
  __m256 _a_1;
  int i_1;
  int h_1;
  int w_2;
  __m256 _p;
  __m256 _b;
  __m256 _a;
  float *ptr;
  int i;
  int w_1;
  int elempack;
  int dims;
  undefined8 in_stack_fffffffffffff3c8;
  Mat *this_00;
  Mat *in_stack_fffffffffffff3d0;
  undefined8 local_c10;
  undefined8 uStack_c08;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  Option *in_stack_fffffffffffff468;
  Mat *in_stack_fffffffffffff470;
  BatchNorm *in_stack_fffffffffffff478;
  int local_b74;
  Mat local_b68;
  float *local_b20;
  int local_b14;
  int local_b10;
  int local_b0c;
  int local_b08;
  int local_b04;
  undefined8 local_b00;
  undefined8 uStack_af8;
  int local_ae4;
  Mat local_ae0;
  Mat *local_a98;
  undefined8 local_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  int local_a68;
  int local_a64;
  int local_a60;
  int local_a5c;
  int local_a58;
  int local_a54;
  undefined8 local_a50;
  undefined8 uStack_a48;
  int local_a3c;
  float *local_a38;
  undefined8 local_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  int local_a0c;
  int local_a08;
  int local_a04;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 local_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  float *local_9d0;
  int local_9c8;
  int local_9c4;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  int local_9a0;
  Mat local_990;
  float *local_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  int local_8f8;
  int local_8f4;
  int local_8f0;
  int local_8ec;
  int local_8e8;
  int local_8e4;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  int local_8ac;
  float *local_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  int local_84c;
  int local_848;
  int local_844;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  float *local_7c8;
  int local_7c0;
  int local_7bc;
  int local_7b8;
  int local_7b4;
  Mat *local_7a8;
  int local_794;
  float *local_790;
  float *local_788;
  float *local_780;
  float *local_778;
  float *local_770;
  float *local_768;
  float *local_760;
  float *local_758;
  float *local_750;
  float *local_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  float *local_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  float *local_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  float *local_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  float *local_4d8;
  float *local_4d0;
  Mat *local_4c8;
  float *local_4c0;
  float *local_4b8;
  float *local_4b0;
  float *local_4a8;
  float *local_4a0;
  float *local_498;
  float *local_490;
  float *local_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  float *local_368;
  void *local_360;
  int *piStack_358;
  Mat *local_348;
  undefined8 local_340;
  undefined8 uStack_338;
  float *local_328;
  undefined8 local_320;
  undefined8 uStack_318;
  float *local_310;
  float local_308;
  float local_304;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  float local_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  float local_a0;
  float local_9c;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  undefined1 local_80 [32];
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  local_7b4 = in_RSI->dims;
  local_7b8 = in_RSI->elempack;
  local_7a8 = in_RSI;
  if (local_7b8 == 8) {
    local_7b8 = 8;
    if (local_7b4 == 1) {
      local_7bc = in_RSI->w;
      for (local_7c0 = 0; local_7c0 < local_7bc; local_7c0 = local_7c0 + 1) {
        local_7c8 = Mat::operator_cast_to_float_(local_7a8);
        local_7c8 = local_7c8 + (local_7c0 << 3);
        local_748 = Mat::operator_cast_to_float_
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8));
        local_748 = local_748 + (local_7c0 << 3);
        local_800 = *(undefined8 *)local_748;
        uStack_7f8 = *(undefined8 *)(local_748 + 2);
        uStack_7f0 = *(undefined8 *)(local_748 + 4);
        uStack_7e8 = *(undefined8 *)(local_748 + 6);
        local_750 = Mat::operator_cast_to_float_
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240));
        local_750 = local_750 + (local_7c0 << 3);
        local_820 = *(undefined8 *)local_750;
        uStack_818 = *(undefined8 *)(local_750 + 2);
        uStack_810 = *(undefined8 *)(local_750 + 4);
        uStack_808 = *(undefined8 *)(local_750 + 6);
        local_758 = local_7c8;
        uVar4 = *(undefined8 *)local_7c8;
        uVar5 = *(undefined8 *)(local_7c8 + 2);
        uVar10 = *(undefined8 *)(local_7c8 + 4);
        uVar11 = *(undefined8 *)(local_7c8 + 6);
        local_620 = local_800;
        uStack_618 = uStack_7f8;
        uStack_610 = uStack_7f0;
        uStack_608 = uStack_7e8;
        local_5e0._0_4_ = (float)uVar4;
        local_1a0 = (float)local_5e0;
        local_5e0._4_4_ = (float)((ulong)uVar4 >> 0x20);
        fStack_19c = local_5e0._4_4_;
        uStack_5d8._0_4_ = (float)uVar5;
        fStack_198 = (float)uStack_5d8;
        uStack_5d8._4_4_ = (float)((ulong)uVar5 >> 0x20);
        fStack_194 = uStack_5d8._4_4_;
        uStack_5d0._0_4_ = (float)uVar10;
        fStack_190 = (float)uStack_5d0;
        uStack_5d0._4_4_ = (float)((ulong)uVar10 >> 0x20);
        fStack_18c = uStack_5d0._4_4_;
        uStack_5c8._0_4_ = (float)uVar11;
        fStack_188 = (float)uStack_5c8;
        uStack_5c8._4_4_ = (float)((ulong)uVar11 >> 0x20);
        fStack_284 = uStack_5c8._4_4_;
        local_1c0._0_4_ = (float)local_820;
        local_1c0._4_4_ = (float)((ulong)local_820 >> 0x20);
        uStack_1b8._0_4_ = (float)uStack_818;
        uStack_1b8._4_4_ = (float)((ulong)uStack_818 >> 0x20);
        uStack_1b0._0_4_ = (float)uStack_810;
        uStack_1b0._4_4_ = (float)((ulong)uStack_810 >> 0x20);
        uStack_1a8._0_4_ = (float)uStack_808;
        local_2a0 = (float)local_5e0 * (float)local_1c0;
        fStack_29c = local_5e0._4_4_ * local_1c0._4_4_;
        fStack_298 = (float)uStack_5d8 * (float)uStack_1b8;
        fStack_294 = uStack_5d8._4_4_ * uStack_1b8._4_4_;
        fStack_290 = (float)uStack_5d0 * (float)uStack_1b0;
        fStack_28c = uStack_5d0._4_4_ * uStack_1b0._4_4_;
        fStack_288 = (float)uStack_5c8 * (float)uStack_1a8;
        local_2c0._0_4_ = (float)local_800;
        local_2c0._4_4_ = (float)((ulong)local_800 >> 0x20);
        uStack_2b8._0_4_ = (float)uStack_7f8;
        uStack_2b8._4_4_ = (float)((ulong)uStack_7f8 >> 0x20);
        uStack_2b0._0_4_ = (float)uStack_7f0;
        uStack_2b0._4_4_ = (float)((ulong)uStack_7f0 >> 0x20);
        uStack_2a8._0_4_ = (float)uStack_7e8;
        uStack_2a8._4_4_ = (float)((ulong)uStack_7e8 >> 0x20);
        local_840 = CONCAT44(fStack_29c + local_2c0._4_4_,local_2a0 + (float)local_2c0);
        uStack_838 = CONCAT44(fStack_294 + uStack_2b8._4_4_,fStack_298 + (float)uStack_2b8);
        uStack_830 = CONCAT44(fStack_28c + uStack_2b0._4_4_,fStack_290 + (float)uStack_2b0);
        uStack_828 = CONCAT44(uStack_5c8._4_4_ + uStack_2a8._4_4_,fStack_288 + (float)uStack_2a8);
        local_4d8 = local_7c8;
        local_500 = local_840;
        uStack_4f8 = uStack_838;
        uStack_4f0 = uStack_830;
        uStack_4e8 = uStack_828;
        *(undefined8 *)local_7c8 = local_840;
        *(undefined8 *)(local_7c8 + 2) = uStack_838;
        *(undefined8 *)(local_7c8 + 4) = uStack_830;
        *(undefined8 *)(local_7c8 + 6) = uStack_828;
        local_600 = local_820;
        uStack_5f8 = uStack_818;
        uStack_5f0 = uStack_810;
        uStack_5e8 = uStack_808;
        local_5e0 = uVar4;
        uStack_5d8 = uVar5;
        uStack_5d0 = uVar10;
        uStack_5c8 = uVar11;
        local_2c0 = local_800;
        uStack_2b8 = uStack_7f8;
        uStack_2b0 = uStack_7f0;
        uStack_2a8 = uStack_7e8;
        local_1c0 = local_820;
        uStack_1b8 = uStack_818;
        uStack_1b0 = uStack_810;
        uStack_1a8 = uStack_808;
        fStack_184 = fStack_284;
      }
    }
    if (local_7b4 == 2) {
      local_844 = local_7a8->w;
      local_848 = local_7a8->h;
      for (local_84c = 0; local_84c < local_848; local_84c = local_84c + 1) {
        local_760 = Mat::operator_cast_to_float_
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8));
        local_760 = local_760 + (local_84c << 3);
        local_880 = *(undefined8 *)local_760;
        uStack_878 = *(undefined8 *)(local_760 + 2);
        uStack_870 = *(undefined8 *)(local_760 + 4);
        uStack_868 = *(undefined8 *)(local_760 + 6);
        local_768 = Mat::operator_cast_to_float_
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240));
        local_768 = local_768 + (local_84c << 3);
        local_8a0 = *(undefined8 *)local_768;
        uStack_898 = *(undefined8 *)(local_768 + 2);
        uStack_890 = *(undefined8 *)(local_768 + 4);
        uStack_888 = *(undefined8 *)(local_768 + 6);
        local_8a8 = Mat::row(local_7a8,local_84c);
        for (local_8ac = 0; local_8ac < local_844; local_8ac = local_8ac + 1) {
          local_770 = local_8a8;
          uVar4 = *(undefined8 *)local_8a8;
          uVar5 = *(undefined8 *)(local_8a8 + 2);
          uVar10 = *(undefined8 *)(local_8a8 + 4);
          uVar11 = *(undefined8 *)(local_8a8 + 6);
          local_660 = local_8a0;
          uStack_658 = uStack_898;
          uStack_650 = uStack_890;
          uStack_648 = uStack_888;
          local_680 = local_880;
          uStack_678 = uStack_878;
          uStack_670 = uStack_870;
          uStack_668 = uStack_868;
          local_640._0_4_ = (float)uVar4;
          local_160 = (float)local_640;
          local_640._4_4_ = (float)((ulong)uVar4 >> 0x20);
          fStack_15c = local_640._4_4_;
          uStack_638._0_4_ = (float)uVar5;
          fStack_158 = (float)uStack_638;
          uStack_638._4_4_ = (float)((ulong)uVar5 >> 0x20);
          fStack_154 = uStack_638._4_4_;
          uStack_630._0_4_ = (float)uVar10;
          fStack_150 = (float)uStack_630;
          uStack_630._4_4_ = (float)((ulong)uVar10 >> 0x20);
          fStack_14c = uStack_630._4_4_;
          uStack_628._0_4_ = (float)uVar11;
          fStack_148 = (float)uStack_628;
          uStack_628._4_4_ = (float)((ulong)uVar11 >> 0x20);
          fStack_244 = uStack_628._4_4_;
          local_180._0_4_ = (float)local_8a0;
          local_180._4_4_ = (float)((ulong)local_8a0 >> 0x20);
          uStack_178._0_4_ = (float)uStack_898;
          uStack_178._4_4_ = (float)((ulong)uStack_898 >> 0x20);
          uStack_170._0_4_ = (float)uStack_890;
          uStack_170._4_4_ = (float)((ulong)uStack_890 >> 0x20);
          uStack_168._0_4_ = (float)uStack_888;
          local_260 = (float)local_640 * (float)local_180;
          fStack_25c = local_640._4_4_ * local_180._4_4_;
          fStack_258 = (float)uStack_638 * (float)uStack_178;
          fStack_254 = uStack_638._4_4_ * uStack_178._4_4_;
          fStack_250 = (float)uStack_630 * (float)uStack_170;
          fStack_24c = uStack_630._4_4_ * uStack_170._4_4_;
          fStack_248 = (float)uStack_628 * (float)uStack_168;
          local_280._0_4_ = (float)local_880;
          local_280._4_4_ = (float)((ulong)local_880 >> 0x20);
          uStack_278._0_4_ = (float)uStack_878;
          uStack_278._4_4_ = (float)((ulong)uStack_878 >> 0x20);
          uStack_270._0_4_ = (float)uStack_870;
          uStack_270._4_4_ = (float)((ulong)uStack_870 >> 0x20);
          uStack_268._0_4_ = (float)uStack_868;
          uStack_268._4_4_ = (float)((ulong)uStack_868 >> 0x20);
          local_8e0 = CONCAT44(fStack_25c + local_280._4_4_,local_260 + (float)local_280);
          uStack_8d8 = CONCAT44(fStack_254 + uStack_278._4_4_,fStack_258 + (float)uStack_278);
          uStack_8d0 = CONCAT44(fStack_24c + uStack_270._4_4_,fStack_250 + (float)uStack_270);
          uStack_8c8 = CONCAT44(uStack_628._4_4_ + uStack_268._4_4_,fStack_248 + (float)uStack_268);
          local_508 = local_8a8;
          local_540 = local_8e0;
          uStack_538 = uStack_8d8;
          uStack_530 = uStack_8d0;
          uStack_528 = uStack_8c8;
          *(undefined8 *)local_8a8 = local_8e0;
          *(undefined8 *)(local_8a8 + 2) = uStack_8d8;
          *(undefined8 *)(local_8a8 + 4) = uStack_8d0;
          *(undefined8 *)(local_8a8 + 6) = uStack_8c8;
          local_8a8 = local_8a8 + 8;
          local_640 = uVar4;
          uStack_638 = uVar5;
          uStack_630 = uVar10;
          uStack_628 = uVar11;
          local_280 = local_880;
          uStack_278 = uStack_878;
          uStack_270 = uStack_870;
          uStack_268 = uStack_868;
          local_180 = local_8a0;
          uStack_178 = uStack_898;
          uStack_170 = uStack_890;
          uStack_168 = uStack_888;
          fStack_144 = fStack_244;
        }
      }
    }
    if ((local_7b4 == 3) || (local_7b4 == 4)) {
      local_8e4 = local_7a8->w;
      local_8e8 = local_7a8->h;
      local_8ec = local_7a8->d;
      local_8f0 = local_7a8->c;
      local_8f4 = local_8e4 * local_8e8 * local_8ec;
      for (local_8f8 = 0; local_8f8 < local_8f0; local_8f8 = local_8f8 + 1) {
        local_778 = Mat::operator_cast_to_float_
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8));
        local_778 = local_778 + (local_8f8 << 3);
        local_920 = *(undefined8 *)local_778;
        uStack_918 = *(undefined8 *)(local_778 + 2);
        uStack_910 = *(undefined8 *)(local_778 + 4);
        uStack_908 = *(undefined8 *)(local_778 + 6);
        local_780 = Mat::operator_cast_to_float_
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240));
        local_780 = local_780 + (local_8f8 << 3);
        local_940 = *(undefined8 *)local_780;
        uStack_938 = *(undefined8 *)(local_780 + 2);
        uStack_930 = *(undefined8 *)(local_780 + 4);
        uStack_928 = *(undefined8 *)(local_780 + 6);
        Mat::channel(in_stack_fffffffffffff3d0,(int)((ulong)in_stack_fffffffffffff3c8 >> 0x20));
        pfVar12 = Mat::operator_cast_to_float_(&local_990);
        Mat::~Mat((Mat *)0x19f73b);
        local_948 = pfVar12;
        for (local_9a0 = 0; local_9a0 < local_8f4; local_9a0 = local_9a0 + 1) {
          local_788 = local_948;
          uVar4 = *(undefined8 *)local_948;
          uVar5 = *(undefined8 *)(local_948 + 2);
          uVar10 = *(undefined8 *)(local_948 + 4);
          uVar11 = *(undefined8 *)(local_948 + 6);
          local_6c0 = local_940;
          uStack_6b8 = uStack_938;
          uStack_6b0 = uStack_930;
          uStack_6a8 = uStack_928;
          local_6e0 = local_920;
          uStack_6d8 = uStack_918;
          uStack_6d0 = uStack_910;
          uStack_6c8 = uStack_908;
          local_6a0._0_4_ = (float)uVar4;
          local_120 = (float)local_6a0;
          local_6a0._4_4_ = (float)((ulong)uVar4 >> 0x20);
          fStack_11c = local_6a0._4_4_;
          uStack_698._0_4_ = (float)uVar5;
          fStack_118 = (float)uStack_698;
          uStack_698._4_4_ = (float)((ulong)uVar5 >> 0x20);
          fStack_114 = uStack_698._4_4_;
          uStack_690._0_4_ = (float)uVar10;
          fStack_110 = (float)uStack_690;
          uStack_690._4_4_ = (float)((ulong)uVar10 >> 0x20);
          fStack_10c = uStack_690._4_4_;
          uStack_688._0_4_ = (float)uVar11;
          fStack_108 = (float)uStack_688;
          uStack_688._4_4_ = (float)((ulong)uVar11 >> 0x20);
          fStack_204 = uStack_688._4_4_;
          local_140._0_4_ = (float)local_940;
          local_140._4_4_ = (float)((ulong)local_940 >> 0x20);
          uStack_138._0_4_ = (float)uStack_938;
          uStack_138._4_4_ = (float)((ulong)uStack_938 >> 0x20);
          uStack_130._0_4_ = (float)uStack_930;
          uStack_130._4_4_ = (float)((ulong)uStack_930 >> 0x20);
          uStack_128._0_4_ = (float)uStack_928;
          local_220 = (float)local_6a0 * (float)local_140;
          fStack_21c = local_6a0._4_4_ * local_140._4_4_;
          fStack_218 = (float)uStack_698 * (float)uStack_138;
          fStack_214 = uStack_698._4_4_ * uStack_138._4_4_;
          fStack_210 = (float)uStack_690 * (float)uStack_130;
          fStack_20c = uStack_690._4_4_ * uStack_130._4_4_;
          fStack_208 = (float)uStack_688 * (float)uStack_128;
          local_240._0_4_ = (float)local_920;
          local_240._4_4_ = (float)((ulong)local_920 >> 0x20);
          uStack_238._0_4_ = (float)uStack_918;
          uStack_238._4_4_ = (float)((ulong)uStack_918 >> 0x20);
          uStack_230._0_4_ = (float)uStack_910;
          uStack_230._4_4_ = (float)((ulong)uStack_910 >> 0x20);
          uStack_228._0_4_ = (float)uStack_908;
          uStack_228._4_4_ = (float)((ulong)uStack_908 >> 0x20);
          local_9c0 = CONCAT44(fStack_21c + local_240._4_4_,local_220 + (float)local_240);
          uStack_9b8 = CONCAT44(fStack_214 + uStack_238._4_4_,fStack_218 + (float)uStack_238);
          uStack_9b0 = CONCAT44(fStack_20c + uStack_230._4_4_,fStack_210 + (float)uStack_230);
          uStack_9a8 = CONCAT44(uStack_688._4_4_ + uStack_228._4_4_,fStack_208 + (float)uStack_228);
          local_548 = local_948;
          local_580 = local_9c0;
          uStack_578 = uStack_9b8;
          uStack_570 = uStack_9b0;
          uStack_568 = uStack_9a8;
          *(undefined8 *)local_948 = local_9c0;
          *(undefined8 *)(local_948 + 2) = uStack_9b8;
          *(undefined8 *)(local_948 + 4) = uStack_9b0;
          *(undefined8 *)(local_948 + 6) = uStack_9a8;
          local_948 = local_948 + 8;
          local_6a0 = uVar4;
          uStack_698 = uVar5;
          uStack_690 = uVar10;
          uStack_688 = uVar11;
          local_240 = local_920;
          uStack_238 = uStack_918;
          uStack_230 = uStack_910;
          uStack_228 = uStack_908;
          local_140 = local_940;
          uStack_138 = uStack_938;
          uStack_130 = uStack_930;
          uStack_128 = uStack_928;
          fStack_104 = fStack_204;
        }
      }
    }
    local_794 = 0;
  }
  else if (local_7b8 == 4) {
    local_7b8 = 4;
    if (local_7b4 == 1) {
      local_9c4 = in_RSI->w;
      for (local_9c8 = 0; local_9c8 < local_9c4; local_9c8 = local_9c8 + 1) {
        local_9d0 = Mat::operator_cast_to_float_(local_7a8);
        local_9d0 = local_9d0 + (local_9c8 << 2);
        local_488 = Mat::operator_cast_to_float_
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8));
        local_488 = local_488 + (local_9c8 << 2);
        local_9e0 = *(undefined8 *)local_488;
        uStack_9d8 = *(undefined8 *)(local_488 + 2);
        local_490 = Mat::operator_cast_to_float_
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240));
        local_490 = local_490 + (local_9c8 << 2);
        local_9f0 = *(undefined8 *)local_490;
        uStack_9e8 = *(undefined8 *)(local_490 + 2);
        local_498 = local_9d0;
        uVar4 = *(undefined8 *)local_9d0;
        uVar5 = *(undefined8 *)(local_9d0 + 2);
        local_410._0_4_ = (float)uVar4;
        local_410._4_4_ = (float)((ulong)uVar4 >> 0x20);
        uStack_408._0_4_ = (float)uVar5;
        uStack_408._4_4_ = (float)((ulong)uVar5 >> 0x20);
        local_420._0_4_ = (float)local_9f0;
        local_420._4_4_ = (float)((ulong)local_9f0 >> 0x20);
        uStack_418._0_4_ = (float)uStack_9e8;
        uStack_418._4_4_ = (float)((ulong)uStack_9e8 >> 0x20);
        local_a00 = CONCAT44(local_410._4_4_ * local_420._4_4_,(float)local_410 * (float)local_420);
        uStack_9f8 = CONCAT44(uStack_408._4_4_ * uStack_418._4_4_,
                              (float)uStack_408 * (float)uStack_418);
        local_390 = local_a00;
        uStack_388 = uStack_9f8;
        local_3a0._0_4_ = (float)local_9e0;
        local_3a0._4_4_ = (float)((ulong)local_9e0 >> 0x20);
        uStack_398._0_4_ = (float)uStack_9d8;
        uStack_398._4_4_ = (float)((ulong)uStack_9d8 >> 0x20);
        local_a00 = CONCAT44(local_410._4_4_ * local_420._4_4_ + local_3a0._4_4_,
                             (float)local_410 * (float)local_420 + (float)local_3a0);
        uStack_9f8 = CONCAT44(uStack_408._4_4_ * uStack_418._4_4_ + uStack_398._4_4_,
                              (float)uStack_408 * (float)uStack_418 + (float)uStack_398);
        local_310 = local_9d0;
        local_320 = local_a00;
        uStack_318 = uStack_9f8;
        *(undefined8 *)local_9d0 = local_a00;
        *(undefined8 *)(local_9d0 + 2) = uStack_9f8;
        local_420 = local_9f0;
        uStack_418 = uStack_9e8;
        local_410 = uVar4;
        uStack_408 = uVar5;
        local_3a0 = local_9e0;
        uStack_398 = uStack_9d8;
      }
    }
    if (local_7b4 == 2) {
      local_a04 = local_7a8->w;
      local_a08 = local_7a8->h;
      for (local_a0c = 0; local_a0c < local_a08; local_a0c = local_a0c + 1) {
        local_4a0 = Mat::operator_cast_to_float_
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8));
        local_4a0 = local_4a0 + (local_a0c << 2);
        local_a20 = *(undefined8 *)local_4a0;
        uStack_a18 = *(undefined8 *)(local_4a0 + 2);
        local_4a8 = Mat::operator_cast_to_float_
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240));
        local_4a8 = local_4a8 + (local_a0c << 2);
        local_a30 = *(undefined8 *)local_4a8;
        uStack_a28 = *(undefined8 *)(local_4a8 + 2);
        local_a38 = Mat::row(local_7a8,local_a0c);
        for (local_a3c = 0; local_a3c < local_a04; local_a3c = local_a3c + 1) {
          local_4b0 = local_a38;
          uVar4 = *(undefined8 *)local_a38;
          uVar5 = *(undefined8 *)(local_a38 + 2);
          local_430._0_4_ = (float)uVar4;
          local_430._4_4_ = (float)((ulong)uVar4 >> 0x20);
          uStack_428._0_4_ = (float)uVar5;
          uStack_428._4_4_ = (float)((ulong)uVar5 >> 0x20);
          local_440._0_4_ = (float)local_a30;
          local_440._4_4_ = (float)((ulong)local_a30 >> 0x20);
          uStack_438._0_4_ = (float)uStack_a28;
          uStack_438._4_4_ = (float)((ulong)uStack_a28 >> 0x20);
          local_a50 = CONCAT44(local_430._4_4_ * local_440._4_4_,(float)local_430 * (float)local_440
                              );
          uStack_a48 = CONCAT44(uStack_428._4_4_ * uStack_438._4_4_,
                                (float)uStack_428 * (float)uStack_438);
          local_3b0 = local_a50;
          uStack_3a8 = uStack_a48;
          local_3c0._0_4_ = (float)local_a20;
          local_3c0._4_4_ = (float)((ulong)local_a20 >> 0x20);
          uStack_3b8._0_4_ = (float)uStack_a18;
          uStack_3b8._4_4_ = (float)((ulong)uStack_a18 >> 0x20);
          local_a50 = CONCAT44(local_430._4_4_ * local_440._4_4_ + local_3c0._4_4_,
                               (float)local_430 * (float)local_440 + (float)local_3c0);
          uStack_a48 = CONCAT44(uStack_428._4_4_ * uStack_438._4_4_ + uStack_3b8._4_4_,
                                (float)uStack_428 * (float)uStack_438 + (float)uStack_3b8);
          local_328 = local_a38;
          local_340 = local_a50;
          uStack_338 = uStack_a48;
          *(undefined8 *)local_a38 = local_a50;
          *(undefined8 *)(local_a38 + 2) = uStack_a48;
          local_a38 = local_a38 + 4;
          local_440 = local_a30;
          uStack_438 = uStack_a28;
          local_430 = uVar4;
          uStack_428 = uVar5;
          local_3c0 = local_a20;
          uStack_3b8 = uStack_a18;
        }
      }
    }
    if ((local_7b4 == 3) || (local_7b4 == 4)) {
      local_a54 = local_7a8->w;
      local_a58 = local_7a8->h;
      local_a5c = local_7a8->d;
      local_a60 = local_7a8->c;
      local_a64 = local_a54 * local_a58 * local_a5c;
      for (local_a68 = 0; local_a68 < local_a60; local_a68 = local_a68 + 1) {
        local_4b8 = Mat::operator_cast_to_float_
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8));
        local_4b8 = local_4b8 + (local_a68 << 2);
        local_a80 = *(undefined8 *)local_4b8;
        uStack_a78 = *(undefined8 *)(local_4b8 + 2);
        local_4c0 = Mat::operator_cast_to_float_
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240));
        local_4c0 = local_4c0 + (local_a68 << 2);
        local_a90 = *(undefined8 *)local_4c0;
        uStack_a88 = *(undefined8 *)(local_4c0 + 2);
        this_00 = &local_ae0;
        Mat::channel(in_stack_fffffffffffff3d0,(int)((ulong)this_00 >> 0x20));
        in_stack_fffffffffffff3d0 = (Mat *)Mat::operator_cast_to_float_(this_00);
        Mat::~Mat((Mat *)0x19fe82);
        local_a98 = in_stack_fffffffffffff3d0;
        for (local_ae4 = 0; local_ae4 < local_a64; local_ae4 = local_ae4 + 1) {
          local_4c8 = local_a98;
          pvVar6 = local_a98->data;
          piVar7 = local_a98->refcount;
          local_450._0_4_ = SUB84(pvVar6,0);
          local_450._4_4_ = (float)((ulong)pvVar6 >> 0x20);
          uStack_448._0_4_ = SUB84(piVar7,0);
          uStack_448._4_4_ = (float)((ulong)piVar7 >> 0x20);
          local_460._0_4_ = (float)local_a90;
          local_460._4_4_ = (float)((ulong)local_a90 >> 0x20);
          uStack_458._0_4_ = (float)uStack_a88;
          uStack_458._4_4_ = (float)((ulong)uStack_a88 >> 0x20);
          local_b00 = (void *)CONCAT44(local_450._4_4_ * local_460._4_4_,
                                       (float)local_450 * (float)local_460);
          uStack_af8 = (int *)CONCAT44(uStack_448._4_4_ * uStack_458._4_4_,
                                       (float)uStack_448 * (float)uStack_458);
          local_3d0 = local_b00;
          uStack_3c8 = uStack_af8;
          local_3e0._0_4_ = (float)local_a80;
          local_3e0._4_4_ = (float)((ulong)local_a80 >> 0x20);
          uStack_3d8._0_4_ = (float)uStack_a78;
          uStack_3d8._4_4_ = (float)((ulong)uStack_a78 >> 0x20);
          local_b00 = (void *)CONCAT44(local_450._4_4_ * local_460._4_4_ + local_3e0._4_4_,
                                       (float)local_450 * (float)local_460 + (float)local_3e0);
          uStack_af8 = (int *)CONCAT44(uStack_448._4_4_ * uStack_458._4_4_ + uStack_3d8._4_4_,
                                       (float)uStack_448 * (float)uStack_458 + (float)uStack_3d8);
          local_348 = local_a98;
          local_360 = local_b00;
          piStack_358 = uStack_af8;
          local_a98->data = local_b00;
          local_a98->refcount = uStack_af8;
          local_a98 = (Mat *)&local_a98->elemsize;
          local_460 = local_a90;
          uStack_458 = uStack_a88;
          local_450 = pvVar6;
          uStack_448 = piVar7;
          local_3e0 = local_a80;
          uStack_3d8 = uStack_a78;
        }
      }
    }
    local_794 = 0;
  }
  else if ((local_7b4 == 3) || (local_7b4 == 4)) {
    local_b04 = in_RSI->w;
    local_b08 = in_RSI->h;
    local_b0c = in_RSI->d;
    local_b10 = local_b04 * local_b08 * local_b0c;
    for (local_b14 = 0; local_b14 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        local_b14 = local_b14 + 1) {
      Mat::channel(in_stack_fffffffffffff3d0,(int)((ulong)in_stack_fffffffffffff3c8 >> 0x20));
      pfVar12 = Mat::operator_cast_to_float_(&local_b68);
      Mat::~Mat((Mat *)0x1a0104);
      local_b20 = pfVar12;
      pfVar12 = Mat::operator[]((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8),
                                (long)local_b14);
      fVar1 = *pfVar12;
      pfVar12 = Mat::operator[]((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240),
                                (long)local_b14);
      local_308 = *pfVar12;
      local_b74 = 0;
      auVar2 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)fVar1),0x20);
      local_c0 = vinsertps_avx(auVar2,ZEXT416((uint)fVar1),0x30);
      auVar2 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)fVar1),0x20);
      auStack_b0 = vinsertps_avx(auVar2,ZEXT416((uint)fVar1),0x30);
      auVar2 = vinsertps_avx(ZEXT416((uint)local_308),ZEXT416((uint)local_308),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_308),0x20);
      auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_308),0x30);
      auVar3 = vinsertps_avx(ZEXT416((uint)local_308),ZEXT416((uint)local_308),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)local_308),0x20);
      auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)local_308),0x30);
      auVar13._16_16_ = auVar2;
      auVar13._0_16_ = auVar3;
      local_80._0_8_ = auVar3._0_8_;
      local_80._8_8_ = auVar3._8_8_;
      local_80._16_8_ = auVar2._0_8_;
      local_80._24_8_ = auVar2._8_8_;
      while( true ) {
        uVar11 = uStack_f8;
        uVar10 = local_100;
        uVar5 = uStack_1f8;
        uVar4 = local_200;
        local_100._0_4_ = auVar3._0_4_;
        local_100._4_4_ = auVar3._4_4_;
        uStack_f8._0_4_ = auVar3._8_4_;
        uStack_f8._4_4_ = auVar3._12_4_;
        local_200._0_4_ = local_c0._0_4_;
        local_200._4_4_ = local_c0._4_4_;
        uStack_1f8._0_4_ = local_c0._8_4_;
        uStack_1f8._4_4_ = local_c0._12_4_;
        if (local_b10 <= local_b74 + 7) break;
        local_790 = local_b20;
        uVar4 = *(undefined8 *)local_b20;
        uVar5 = *(undefined8 *)(local_b20 + 2);
        uVar10 = *(undefined8 *)(local_b20 + 4);
        uVar11 = *(undefined8 *)(local_b20 + 6);
        local_720 = local_80._0_8_;
        uStack_718 = local_80._8_8_;
        uStack_710 = local_80._16_8_;
        uStack_708 = local_80._24_8_;
        local_740 = local_c0._0_8_;
        uStack_738 = local_c0._8_8_;
        uStack_730 = auStack_b0._0_8_;
        uStack_728 = auStack_b0._8_8_;
        local_700._0_4_ = (float)uVar4;
        local_e0 = (float)local_700;
        local_700._4_4_ = (float)((ulong)uVar4 >> 0x20);
        fStack_dc = local_700._4_4_;
        uStack_6f8._0_4_ = (float)uVar5;
        fStack_d8 = (float)uStack_6f8;
        uStack_6f8._4_4_ = (float)((ulong)uVar5 >> 0x20);
        fStack_d4 = uStack_6f8._4_4_;
        uStack_6f0._0_4_ = (float)uVar10;
        fStack_d0 = (float)uStack_6f0;
        uStack_6f0._4_4_ = (float)((ulong)uVar10 >> 0x20);
        fStack_cc = uStack_6f0._4_4_;
        uStack_6e8._0_4_ = (float)uVar11;
        fStack_c8 = (float)uStack_6e8;
        uStack_6e8._4_4_ = (float)((ulong)uVar11 >> 0x20);
        fStack_1c4 = uStack_6e8._4_4_;
        uStack_f0._0_4_ = auVar2._0_4_;
        uStack_f0._4_4_ = auVar2._4_4_;
        uStack_e8._0_4_ = auVar2._8_4_;
        local_1e0 = (float)local_700 * (float)local_100;
        fStack_1dc = local_700._4_4_ * local_100._4_4_;
        fStack_1d8 = (float)uStack_6f8 * (float)uStack_f8;
        fStack_1d4 = uStack_6f8._4_4_ * uStack_f8._4_4_;
        fStack_1d0 = (float)uStack_6f0 * (float)uStack_f0;
        fStack_1cc = uStack_6f0._4_4_ * uStack_f0._4_4_;
        fStack_1c8 = (float)uStack_6e8 * (float)uStack_e8;
        uStack_1f0._0_4_ = auStack_b0._0_4_;
        uStack_1f0._4_4_ = auStack_b0._4_4_;
        uStack_1e8._0_4_ = auStack_b0._8_4_;
        uStack_1e8._4_4_ = auStack_b0._12_4_;
        local_be0 = CONCAT44(fStack_1dc + local_200._4_4_,local_1e0 + (float)local_200);
        uStack_bd8 = CONCAT44(fStack_1d4 + uStack_1f8._4_4_,fStack_1d8 + (float)uStack_1f8);
        uStack_bd0 = CONCAT44(fStack_1cc + uStack_1f0._4_4_,fStack_1d0 + (float)uStack_1f0);
        uStack_bc8 = CONCAT44(uStack_6e8._4_4_ + uStack_1e8._4_4_,fStack_1c8 + (float)uStack_1e8);
        local_588 = local_b20;
        local_5c0 = local_be0;
        uStack_5b8 = uStack_bd8;
        uStack_5b0 = uStack_bd0;
        uStack_5a8 = uStack_bc8;
        *(undefined8 *)local_b20 = local_be0;
        *(undefined8 *)(local_b20 + 2) = uStack_bd8;
        *(undefined8 *)(local_b20 + 4) = uStack_bd0;
        *(undefined8 *)(local_b20 + 6) = uStack_bc8;
        local_b20 = local_b20 + 8;
        local_b74 = local_b74 + 8;
        local_700 = uVar4;
        uStack_6f8 = uVar5;
        uStack_6f0 = uVar10;
        uStack_6e8 = uVar11;
        local_200 = local_c0._0_8_;
        uStack_1f8 = local_c0._8_8_;
        uStack_1f0 = auStack_b0._0_8_;
        uStack_1e8 = auStack_b0._8_8_;
        local_100 = local_80._0_8_;
        uStack_f8 = local_80._8_8_;
        uStack_f0 = local_80._16_8_;
        uStack_e8 = local_80._24_8_;
        fStack_c4 = fStack_1c4;
      }
      local_2e0 = local_c0._0_8_;
      uStack_2d8 = local_c0._8_8_;
      uStack_2d0 = auStack_b0._0_8_;
      uStack_2c8 = auStack_b0._8_8_;
      local_300 = local_80._0_8_;
      uStack_2f8 = local_80._8_8_;
      uStack_2f0 = local_80._16_8_;
      uStack_2e8 = local_80._24_8_;
      for (; local_b74 + 3 < local_b10; local_b74 = local_b74 + 4) {
        local_4d0 = local_b20;
        uVar8 = *(undefined8 *)local_b20;
        uVar9 = *(undefined8 *)(local_b20 + 2);
        local_480 = local_80._0_8_;
        uStack_478 = local_80._8_8_;
        local_470._0_4_ = (float)uVar8;
        local_470._4_4_ = (float)((ulong)uVar8 >> 0x20);
        uStack_468._0_4_ = (float)uVar9;
        uStack_468._4_4_ = (float)((ulong)uVar9 >> 0x20);
        local_c10 = CONCAT44(local_470._4_4_ * local_100._4_4_,(float)local_470 * (float)local_100);
        uStack_c08 = CONCAT44(uStack_468._4_4_ * uStack_f8._4_4_,
                              (float)uStack_468 * (float)uStack_f8);
        local_3f0 = local_c10;
        uStack_3e8 = uStack_c08;
        local_400 = local_c0._0_8_;
        uStack_3f8 = local_c0._8_8_;
        local_c10 = CONCAT44(local_470._4_4_ * local_100._4_4_ + local_200._4_4_,
                             (float)local_470 * (float)local_100 + (float)local_200);
        uStack_c08 = CONCAT44(uStack_468._4_4_ * uStack_f8._4_4_ + uStack_1f8._4_4_,
                              (float)uStack_468 * (float)uStack_f8 + (float)uStack_1f8);
        local_368 = local_b20;
        local_380 = local_c10;
        uStack_378 = uStack_c08;
        *(undefined8 *)local_b20 = local_c10;
        *(undefined8 *)(local_b20 + 2) = uStack_c08;
        local_b20 = local_b20 + 4;
        local_470 = uVar8;
        uStack_468 = uVar9;
      }
      for (; local_b74 < local_b10; local_b74 = local_b74 + 1) {
        *local_b20 = local_308 * *local_b20 + fVar1;
        local_b20 = local_b20 + 1;
      }
      local_304 = fVar1;
      local_200 = uVar4;
      uStack_1f8 = uVar5;
      local_100 = uVar10;
      uStack_f8 = uVar11;
      local_a0 = fVar1;
      local_9c = fVar1;
      local_98 = fVar1;
      local_94 = fVar1;
      local_90 = fVar1;
      local_8c = fVar1;
      local_88 = fVar1;
      local_84 = fVar1;
      local_80 = auVar13;
      local_50 = local_308;
      local_4c = local_308;
      local_48 = local_308;
      local_44 = local_308;
      local_40 = local_308;
      local_3c = local_308;
      local_38 = local_308;
      local_34 = local_308;
    }
    local_794 = 0;
  }
  else {
    local_794 = BatchNorm::forward_inplace
                          (in_stack_fffffffffffff478,in_stack_fffffffffffff470,
                           in_stack_fffffffffffff468);
  }
  return local_794;
}

Assistant:

int BatchNorm_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;

    int elempack = bottom_top_blob.elempack;

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 8;

                __m256 _a = _mm256_loadu_ps((const float*)a_data + i * 8);
                __m256 _b = _mm256_loadu_ps((const float*)b_data + i * 8);

                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_comp_fmadd_ps(_p, _b, _a);
                _mm256_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                __m256 _a = _mm256_loadu_ps((const float*)a_data + i * 8);
                __m256 _b = _mm256_loadu_ps((const float*)b_data + i * 8);

                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _b, _a);
                    _mm256_storeu_ps(ptr, _p);

                    ptr += 8;
                }
            }
        }

        if (dims == 3 || dims == 4)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int d = bottom_top_blob.d;
            int c = bottom_top_blob.c;
            int size = w * h * d;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < c; q++)
            {
                __m256 _a = _mm256_loadu_ps((const float*)a_data + q * 8);
                __m256 _b = _mm256_loadu_ps((const float*)b_data + q * 8);

                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _b, _a);
                    _mm256_storeu_ps(ptr, _p);

                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 4;

                __m128 _a = _mm_load_ps((const float*)a_data + i * 4);
                __m128 _b = _mm_load_ps((const float*)b_data + i * 4);

                __m128 _p = _mm_load_ps(ptr);
                _p = _mm_mul_ps(_p, _b);
                _p = _mm_add_ps(_p, _a);
                _mm_store_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                __m128 _a = _mm_load_ps((const float*)a_data + i * 4);
                __m128 _b = _mm_load_ps((const float*)b_data + i * 4);

                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    _p = _mm_mul_ps(_p, _b);
                    _p = _mm_add_ps(_p, _a);
                    _mm_store_ps(ptr, _p);

                    ptr += 4;
                }
            }
        }

        if (dims == 3 || dims == 4)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int d = bottom_top_blob.d;
            int c = bottom_top_blob.c;
            int size = w * h * d;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < c; q++)
            {
                __m128 _a = _mm_load_ps((const float*)a_data + q * 4);
                __m128 _b = _mm_load_ps((const float*)b_data + q * 4);

                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    _p = _mm_mul_ps(_p, _b);
                    _p = _mm_add_ps(_p, _a);
                    _mm_store_ps(ptr, _p);

                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (dims != 3 && dims != 4)
        return BatchNorm::forward_inplace(bottom_top_blob, opt);

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    // int c = bottom_top_blob.c;
    int size = w * h * d;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        float a = a_data[q];
        float b = b_data[q];

        int i = 0;
#if __SSE2__
#if __AVX__
        __m256 _a256 = _mm256_set1_ps(a);
        __m256 _b256 = _mm256_set1_ps(b);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_comp_fmadd_ps(_p, _b256, _a256);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
        __m128 _a128 = _mm256_castps256_ps128(_a256);
        __m128 _b128 = _mm256_castps256_ps128(_b256);
#else
        __m128 _a128 = _mm_set1_ps(a);
        __m128 _b128 = _mm_set1_ps(b);
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_mul_ps(_p, _b128);
            _p = _mm_add_ps(_p, _a128);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = b * *ptr + a;

            ptr++;
        }
    }

    return 0;
}